

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O3

void hatch_egg(void *arg,long timeout)

{
  char cVar1;
  level *lev;
  bool bVar2;
  byte bVar3;
  boolean bVar4;
  int iVar5;
  uint uVar6;
  monst *pmVar7;
  monst *pmVar8;
  char *pcVar9;
  undefined8 in_RCX;
  long lVar10;
  char *pcVar11;
  uint uVar12;
  int iVar13;
  byte bVar15;
  char *pcVar16;
  ulong uVar17;
  monst *mtmp;
  xchar y;
  xchar x;
  coord cc;
  char carriedby [256];
  char monnambuf [256];
  char local_259;
  char local_258;
  byte local_257;
  coord local_256;
  uint local_254;
  int local_250;
  int local_24c;
  ulong local_248;
  uchar *local_240;
  char local_238 [8];
  uint local_230;
  char local_138 [264];
  ulong uVar14;
  
  if (*(int *)((long)arg + 0x50) == -1) {
    return;
  }
  iVar5 = big_to_little(*(int *)((long)arg + 0x50));
  if (*(char *)((long)arg + 0x34) == '\0') {
    local_254 = (uint)CONCAT71((int7)((ulong)in_RCX >> 8),1);
    if ((flags.female == '\0') && (*(char *)((long)arg + 0x48) == '\x03')) {
      local_254 = mt_random();
      local_254 = local_254 & 0xffffff01;
    }
  }
  else {
    local_254 = 0;
  }
  uVar17 = (ulong)moves;
  bVar4 = get_obj_location((obj *)arg,&local_258,&local_259,0);
  if (bVar4 == '\0') {
    return;
  }
  iVar13 = *(int *)((long)arg + 0x30);
  local_250 = iVar5;
  uVar6 = mt_random();
  lVar10 = (long)local_250;
  if ((mons[lVar10].geno & 0x1000) != 0) {
    return;
  }
  if ((mvitals[lVar10].mvflags & 3) != 0) {
    return;
  }
  uVar12 = SUB164(ZEXT416(uVar6) % SEXT816((long)iVar13),0) + 1;
  uVar14 = (ulong)uVar12;
  local_257 = (byte)viz_array[local_259][local_258] >> 1 & uVar17 == timeout;
  local_240 = &mvitals[lVar10].mvflags;
  cVar1 = (char)local_254;
  uVar6 = 1;
  if ((int)uVar12 < 1) {
    uVar6 = uVar12;
  }
  local_24c = uVar6 - 1;
  mtmp = (monst *)0x0;
  local_248 = uVar14;
  while( true ) {
    iVar13 = (int)uVar14;
    bVar4 = enexto(&local_256,level,local_258,local_259,mons + lVar10);
    pmVar7 = mtmp;
    iVar5 = iVar13;
    if (bVar4 == '\0') break;
    pmVar7 = makemon(mons + lVar10,level,(int)local_256.x,(int)local_256.y,1);
    if (pmVar7 == (monst *)0x0) {
      pmVar7 = (monst *)0x0;
      break;
    }
    if ((uVar17 == timeout && cVar1 == '\0') ||
       ((*(char *)((long)arg + 0x48) == '\x03' && (pmVar7->data->mlet == '\x1e')))) {
      pmVar8 = tamedog(pmVar7,(obj *)0x0);
      mtmp = (monst *)0x0;
      if ((pmVar8 != (monst *)0x0) &&
         ((pmVar7 = pmVar8, mtmp = pmVar8, *(char *)((long)arg + 0x48) == '\x03' &&
          (pmVar8->data->mlet != '\x1e')))) {
        pmVar8->mtame = '\x14';
      }
    }
    if (((*local_240 & 1) != 0) ||
       (uVar14 = (ulong)(iVar13 - 1), mtmp = pmVar7, iVar5 = local_24c, iVar13 < 2)) break;
  }
  iVar13 = local_250;
  bVar3 = local_257;
  if (pmVar7 != (monst *)0x0) {
    mtmp = pmVar7;
  }
  iVar5 = (int)local_248 - iVar5;
  *(int *)((long)arg + 0x30) = *(int *)((long)arg + 0x30) - iVar5;
  if (mtmp == (monst *)0x0) {
    return;
  }
  if (local_257 != 0) {
    pcVar9 = m_monnam(mtmp);
    pcVar16 = "";
    if (iVar5 < 2) {
      pcVar9 = an(pcVar9);
    }
    else {
      pcVar16 = "some ";
      pcVar9 = makeplural(pcVar9);
    }
    sprintf(local_138,"%s%s",pcVar16,pcVar9);
  }
  cVar1 = *(char *)((long)arg + 0x48);
  if (cVar1 == '\x01') {
    bVar2 = true;
    if (bVar3 == 0) goto LAB_002600d2;
    bVar2 = false;
    pline("You see %s hatch.");
    bVar15 = 1;
  }
  else {
    if (cVar1 == '\x04') {
      bVar2 = true;
      if (bVar3 == 0) goto LAB_002600d2;
      pmVar7 = *(monst **)((long)arg + 8);
      if (pmVar7->wormno == '\0') {
        if ((viz_array[pmVar7->my][pmVar7->mx] & 2U) != 0) goto LAB_0025ffb6;
        if (u.uprops[0x1e].intrinsic == 0) {
          if ((ublindf != (obj *)0x0) && (ublindf->otyp != 0xed)) goto LAB_0025ff53;
          if (((youmonst.data)->mflags1 & 0x1000) != 0) goto LAB_0025ff4a;
        }
        else {
LAB_0025ff4a:
          if (ublindf == (obj *)0x0) goto LAB_00260032;
LAB_0025ff53:
          if (ublindf->oartifact != '\x1d') goto LAB_00260032;
        }
        if ((((u.uprops[0x40].extrinsic != 0 || u.uprops[0x40].intrinsic != 0) ||
             (((youmonst.data)->mflags3 & 0x100) != 0)) &&
            ((viz_array[pmVar7->my][pmVar7->mx] & 1U) != 0)) &&
           ((pmVar7->data->mflags3 & 0x200) != 0)) goto LAB_0025ffb6;
LAB_00260032:
        bVar4 = is_pool(level,(int)mtmp->mx,(int)mtmp->my);
        if (bVar4 == '\0') {
          builtin_strncpy(local_238,"thin air",8);
          local_230 = local_230 & 0xffffff00;
        }
        else {
          builtin_strncpy(local_238,"empty wa",8);
          local_230 = 0x726574;
        }
        bVar15 = 0;
      }
      else {
        bVar4 = worm_known(level,pmVar7);
        if (bVar4 == '\0') goto LAB_00260032;
        pmVar7 = *(monst **)((long)arg + 8);
LAB_0025ffb6:
        uVar6 = *(uint *)&pmVar7->field_0x60;
        if ((((uVar6 & 2) != 0) && (u.uprops[0xc].intrinsic == 0)) && (u.uprops[0xc].extrinsic == 0)
           ) {
          if (((uVar6 & 0x280) == 0) && (((youmonst.data)->mflags1 & 0x1000000) != 0))
          goto LAB_0025fffe;
          goto LAB_00260032;
        }
        if ((uVar6 & 0x280) != 0) goto LAB_00260032;
LAB_0025fffe:
        if ((u._1052_1_ & 0x20) != 0) goto LAB_00260032;
        pcVar16 = a_monnam(pmVar7);
        pcVar16 = s_suffix(pcVar16);
        sprintf(local_238,"%s pack",pcVar16);
        bVar15 = 1;
      }
      pcVar16 = locomotion(mtmp->data,"drop");
      pline("You see %s %s out of %s!",local_138,pcVar16,local_238);
    }
    else {
      if (cVar1 != '\x03') {
        warning("egg hatched where? (%d)");
        bVar2 = true;
        goto LAB_002600d2;
      }
      pcVar16 = locomotion(mtmp->data,"drop");
      if (bVar3 == 0) {
        pline("You feel something %s from your pack!");
      }
      else {
        pline("You see %s %s out of your pack!",local_138,pcVar16);
      }
      if ((char)local_254 == '\0') {
        pcVar16 = "Its";
        if (1 < iVar5) {
          pcVar16 = "Their";
        }
        pcVar9 = "mommy";
        if (flags.female == '\0') {
          pcVar9 = "daddy";
        }
        pcVar11 = ".";
        if (*(char *)((long)arg + 0x34) == '\0') {
          pcVar11 = "?";
        }
        pline("%s cries sound like \"%s%s\"",pcVar16,pcVar9,pcVar11);
        bVar15 = 1;
      }
      else {
        bVar15 = 1;
        if (mtmp->data->mlet == '\x1e') {
          verbalize("Gleep!");
        }
      }
    }
    bVar2 = true;
  }
  if ((bVar3 & bVar15) == 1) {
    iVar5 = little_to_big(iVar13);
    mvitals[iVar5].mvflags = mvitals[iVar5].mvflags | 8;
    update_inventory();
  }
LAB_002600d2:
  if (*(int *)((long)arg + 0x30) < 1) {
    if (*(char *)((long)arg + 0x48) == '\x03') {
      useup((obj *)arg);
    }
    else {
      obj_extract_self((obj *)arg);
      obfree((obj *)arg,(obj *)0x0);
    }
  }
  else {
    attach_egg_hatch_timeout((obj *)arg);
    if (*(char *)((long)arg + 0x49) != '\0') {
      stop_timer(*(level **)((long)arg + 0x20),4,arg);
      lev = *(level **)((long)arg + 0x20);
      uVar6 = mt_random();
      start_timer(lev,(ulong)(uVar6 % 0xc + 1),2,4,arg);
    }
  }
  if (!bVar2) {
    newsym((int)local_258,(int)local_259);
  }
  return;
}

Assistant:

void hatch_egg(void *arg, long timeout)
{
	struct obj *egg;
	struct monst *mon, *mon2;
	coord cc;
	xchar x, y;
	boolean yours, silent, knows_egg = FALSE;
	boolean cansee_hatchspot = FALSE;
	int i, mnum, hatchcount = 0;

	egg = (struct obj *) arg;
	/* sterilized while waiting */
	if (egg->corpsenm == NON_PM) return;

	mon = mon2 = NULL;
	mnum = big_to_little(egg->corpsenm);
	/* The identity of one's father is learned, not innate */
	yours = (egg->spe || (!flags.female && carried(egg) && !rn2(2)));
	silent = (timeout != moves);	/* hatched while away */

	/* only can hatch when in INVENT, FLOOR, MINVENT */
	if (get_obj_location(egg, &x, &y, 0)) {
	    hatchcount = rnd((int)egg->quan);
	    cansee_hatchspot = cansee(x, y) && !silent;
	    if (!(mons[mnum].geno & G_UNIQ) &&
		   !(mvitals[mnum].mvflags & (G_GENOD | G_EXTINCT))) {
		for (i = hatchcount; i > 0; i--) {
		    if (!enexto(&cc, level, x, y, &mons[mnum]) ||
			 !(mon = makemon(&mons[mnum], level, cc.x, cc.y, NO_MINVENT)))
			break;
		    /* tame if your own egg hatches while you're on the
		       same dungeon level, or any dragon egg which hatches
		       while it's in your inventory */
		    if ((yours && !silent) ||
			(carried(egg) && mon->data->mlet == S_DRAGON)) {
			if ((mon2 = tamedog(mon, NULL)) != 0) {
			    mon = mon2;
			    if (carried(egg) && mon->data->mlet != S_DRAGON)
				mon->mtame = 20;
			}
		    }
		    if (mvitals[mnum].mvflags & G_EXTINCT)
			break;	/* just made last one */
		    mon2 = mon;	/* in case makemon() fails on 2nd egg */
		}
		if (!mon) mon = mon2;
		hatchcount -= i;
		egg->quan -= (long)hatchcount;
	    }
	}

	if (mon) {
	    char monnambuf[BUFSZ], carriedby[BUFSZ];
	    boolean siblings = (hatchcount > 1), redraw = FALSE;

	    if (cansee_hatchspot) {
		sprintf(monnambuf, "%s%s",
			siblings ? "some " : "",
			siblings ?
			makeplural(m_monnam(mon)) : an(m_monnam(mon)));
		/* we don't learn the egg type here because learning
		   an egg type requires either seeing the egg hatch
		   or being familiar with the egg already,
		   as well as being able to see the resulting
		   monster, checked below
		*/
	    }
	    switch (egg->where) {
		case OBJ_INVENT:
		    knows_egg = TRUE; /* true even if you are blind */
		    if (!cansee_hatchspot)
			pline("You feel something %s from your pack!",
			    locomotion(mon->data, "drop"));
		    else
			pline("You see %s %s out of your pack!",
			    monnambuf, locomotion(mon->data, "drop"));
		    if (yours) {
			pline("%s cries sound like \"%s%s\"",
			    siblings ? "Their" : "Its",
			    flags.female ? "mommy" : "daddy",
			    egg->spe ? "." : "?");
		    } else if (mon->data->mlet == S_DRAGON) {
			verbalize("Gleep!");		/* Mything eggs :-) */
		    }
		    break;

		case OBJ_FLOOR:
		    if (cansee_hatchspot) {
			knows_egg = TRUE;
			pline("You see %s hatch.", monnambuf);
			redraw = TRUE;	/* update egg's map location */
		    }
		    break;

		case OBJ_MINVENT:
		    if (cansee_hatchspot) {
			/* egg carring monster might be invisible */
			if (canseemon(level, egg->ocarry)) {
			    sprintf(carriedby, "%s pack",
				     s_suffix(a_monnam(egg->ocarry)));
			    knows_egg = TRUE;
			}
			else if (is_pool(level, mon->mx, mon->my))
			    strcpy(carriedby, "empty water");
			else
			    strcpy(carriedby, "thin air");
			pline("You see %s %s out of %s!", monnambuf,
			    locomotion(mon->data, "drop"), carriedby);
		    }
		    break;
		default:
		    warning("egg hatched where? (%d)", (int)egg->where);
		    break;
	    }

	    if (cansee_hatchspot && knows_egg)
		learn_egg_type(mnum);

	    if (egg->quan > 0) {
		/* still some eggs left */
		attach_egg_hatch_timeout(egg);
		if (egg->timed) {
		    /* replace ordinary egg timeout with a short one */
		    stop_timer(egg->olev, HATCH_EGG, egg);
		    start_timer(egg->olev, (long)rnd(12), TIMER_OBJECT,
					HATCH_EGG, egg);
		}
	    } else if (carried(egg)) {
		useup(egg);
	    } else {
		/* free egg here because we use it above */
		obj_extract_self(egg);
		obfree(egg, NULL);
	    }
	    if (redraw) newsym(x, y);
	}
}